

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options)

{
  _func_int *p_Var1;
  DescriptorBuilder *this_00;
  FieldDescriptor *pFVar2;
  bool bVar3;
  anon_union_8_8_13f84498_for_Symbol_2 aVar4;
  Message *pMVar5;
  const_iterator cVar6;
  scoped_ptr<google::protobuf::UnknownFieldSet> p;
  iterator iVar7;
  bool bVar8;
  int iVar9;
  LogMessage *pLVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *pTVar11;
  undefined8 *puVar12;
  long *plVar13;
  undefined4 extraout_var_01;
  UnknownFieldSet *pUVar14;
  string *psVar15;
  undefined4 extraout_var_02;
  size_type *psVar16;
  _func_int **pp_Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_8_8_13f84498_for_Symbol_2 aVar19;
  bool bVar20;
  long *plVar21;
  _func_int *p_Var22;
  undefined8 uVar23;
  UninterpretedOption *pUVar24;
  _Alloc_hider _Var25;
  int index;
  FieldDescriptor **ppFVar26;
  Symbol SVar27;
  FieldDescriptor *field;
  size_type __dnew_1;
  CodedOutputStream out;
  StringOutputStream outstr;
  scoped_ptr<google::protobuf::UnknownFieldSet> unknown_fields;
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  scoped_ptr<google::protobuf::UnknownFieldSet> parent_unknown_fields;
  size_type __dnew;
  anon_union_8_8_13f84498_for_Symbol_2 local_200;
  undefined1 local_1f8 [56];
  undefined1 local_1c0 [56];
  StringOutputStream local_188;
  _func_int *local_178;
  long lStack_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Message *local_148;
  anon_union_8_8_13f84498_for_Symbol_2 local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  const_iterator local_118;
  iterator iStack_110;
  FieldDescriptor **local_108;
  scoped_ptr<google::protobuf::UnknownFieldSet> local_100;
  long local_f8;
  UnknownFieldSet local_f0;
  long lStack_e8;
  _func_int **local_e0;
  long local_d8;
  _func_int *local_d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [56];
  undefined1 local_68 [56];
  
  pUVar24 = this->uninterpreted_option_;
  iVar9 = (pUVar24->name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar9 == 0) {
    local_a0._0_8_ = (long *)0x18;
    local_68._0_8_ = local_68 + 0x10;
    local_68._0_8_ = std::__cxx11::string::_M_create((ulong *)local_68,(ulong)local_a0);
    local_68._16_8_ = local_a0._0_8_;
    *(undefined8 *)local_68._0_8_ = 0x6d206e6f6974704f;
    *(undefined8 *)(local_68._0_8_ + 8) = 0x6576616820747375;
    *(long *)(local_68._0_8_ + 0x10) = 0x2e656d616e206120;
    local_68._8_8_ = local_a0._0_8_;
    *(char *)(local_68._0_8_ + local_a0._0_8_) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_68);
    plVar21 = (long *)local_68._16_8_;
    plVar13 = (long *)local_68._0_8_;
    if ((undefined1 *)local_68._0_8_ == local_68 + 0x10) {
      return false;
    }
  }
  else {
    if (iVar9 < 1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar10 = internal::LogMessage::operator<<
                          ((LogMessage *)local_68,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar10);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
    iVar9 = std::__cxx11::string::compare
                      (*(char **)((long)((pUVar24->name_).super_RepeatedPtrFieldBase.rep_)->elements
                                        [0] + 0x18));
    if (iVar9 != 0) {
      this_00 = this->builder_;
      iVar9 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
      SVar27 = FindSymbolNotEnforcingDepsHelper
                         (this_00,this_00->pool_,*(string **)(CONCAT44(extraout_var,iVar9) + 8),true
                         );
      aVar19 = SVar27.field_1;
      if (SVar27.type != MESSAGE) {
        aVar19._0_4_ = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
        aVar19._4_4_ = extraout_var_00;
      }
      if ((DescriptorBuilder *)aVar19.descriptor == (DescriptorBuilder *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1797);
        pLVar10 = internal::LogMessage::operator<<
                            ((LogMessage *)local_a0,"CHECK failed: options_descriptor: ");
        internal::LogFinisher::operator=((LogFinisher *)local_1f8,pLVar10);
        internal::LogMessage::~LogMessage((LogMessage *)local_a0);
      }
      index = 0;
      local_200.descriptor = (Descriptor *)0x0;
      local_108 = (FieldDescriptor **)0x0;
      local_118._M_current = (FieldDescriptor **)0x0;
      iStack_110._M_current = (FieldDescriptor **)0x0;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      pUVar24 = this->uninterpreted_option_;
      iVar9 = (pUVar24->name_).super_RepeatedPtrFieldBase.current_size_;
      bVar20 = 0 < iVar9;
      local_148 = options;
      bVar8 = bVar20;
      if (0 < iVar9) {
        plVar21 = (long *)(local_1f8 + 0x10);
        bVar8 = true;
        local_140 = aVar19;
        do {
          pTVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                              (&(pUVar24->name_).super_RepeatedPtrFieldBase,index);
          psVar15 = (pTVar11->name_part_).ptr_;
          if (local_138._M_string_length != 0) {
            std::__cxx11::string::append((char *)&local_138);
          }
          pTVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                              (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,
                               index);
          if (pTVar11->is_extension_ == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c0,"(",psVar15);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_1c0);
            psVar16 = puVar12 + 2;
            if ((size_type *)*puVar12 == psVar16) {
              local_1f8._16_8_ = *psVar16;
              local_1f8._24_8_ = puVar12[3];
              local_1f8._0_8_ = plVar21;
            }
            else {
              local_1f8._16_8_ = *psVar16;
              local_1f8._0_8_ = (size_type *)*puVar12;
            }
            local_1f8._8_8_ = puVar12[1];
            *puVar12 = psVar16;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_138,local_1f8._0_8_);
            if ((long *)local_1f8._0_8_ != plVar21) {
              operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1c0 + 0x10)) {
              operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
            }
            aVar19 = (anon_union_8_8_13f84498_for_Symbol_2)this->builder_;
            SVar27 = LookupSymbol((DescriptorBuilder *)aVar19.descriptor,psVar15,
                                  &this->options_to_interpret_->name_scope,PLACEHOLDER_MESSAGE,
                                  LOOKUP_ALL,true);
            if (SVar27.type == FIELD) {
              local_200 = SVar27.field_1;
            }
          }
          else {
            std::__cxx11::string::_M_append((char *)&local_138,(ulong)(psVar15->_M_dataplus)._M_p);
            aVar19 = local_140;
            local_200.field_descriptor = Descriptor::FindFieldByName(local_140.descriptor,psVar15);
          }
          aVar4 = local_200;
          if (local_200.descriptor == (Descriptor *)0x0) {
            if (this->builder_->pool_->allow_unknown_ != false) {
LAB_002ec612:
              AddWithoutInterpreting
                        ((OptionInterpreter *)aVar19.descriptor,this->uninterpreted_option_,
                         local_148);
              bVar20 = true;
              bVar3 = false;
              goto LAB_002ecdf8;
            }
            if ((this->builder_->undefine_resolved_name_)._M_string_length == 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1c0,"Option \"",&local_138);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_1c0);
              psVar16 = puVar12 + 2;
              if ((size_type *)*puVar12 == psVar16) {
                local_1f8._16_8_ = *psVar16;
                local_1f8._24_8_ = puVar12[3];
                local_1f8._0_8_ = plVar21;
              }
              else {
                local_1f8._16_8_ = *psVar16;
                local_1f8._0_8_ = (size_type *)*puVar12;
              }
              local_1f8._8_8_ = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1f8);
              goto LAB_002ecdbb;
            }
            std::operator+(&local_c0,"Option \"",&local_138);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_c0);
            pUVar14 = (UnknownFieldSet *)(plVar13 + 2);
            if ((UnknownFieldSet *)*plVar13 == pUVar14) {
              local_f0.fields_ = pUVar14->fields_;
              lStack_e8 = plVar13[3];
              local_100.ptr_ = &local_f0;
            }
            else {
              local_f0.fields_ = pUVar14->fields_;
              local_100.ptr_ = (UnknownFieldSet *)*plVar13;
            }
            local_f8 = plVar13[1];
            *plVar13 = (long)pUVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_100,
                                 (ulong)(this->builder_->undefine_resolved_name_)._M_dataplus._M_p);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 == paVar18) {
              local_168.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_168.field_2._8_8_ = puVar12[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_168._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_168._M_string_length = puVar12[1];
            *puVar12 = paVar18;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
            local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = &local_178;
            pp_Var17 = (_func_int **)(plVar13 + 2);
            if ((_func_int **)*plVar13 == pp_Var17) {
              local_178 = *pp_Var17;
              lStack_170 = plVar13[3];
            }
            else {
              local_178 = *pp_Var17;
              local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream =
                   (_func_int **)*plVar13;
            }
            local_188.target_ = (string *)plVar13[1];
            *plVar13 = (long)pp_Var17;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_138);
            p_Var22 = (_func_int *)0xf;
            if (local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != &local_178) {
              p_Var22 = local_178;
            }
            p_Var1 = (_func_int *)((long)&((local_188.target_)->_M_dataplus)._M_p + local_d8);
            if (p_Var22 < p_Var1) {
              p_Var22 = (_func_int *)0xf;
              if (local_e0 != local_d0) {
                p_Var22 = local_d0[0];
              }
              if (p_Var22 < p_Var1) goto LAB_002ecad5;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_e0,0,(char *)0x0,
                                   (ulong)local_188.super_ZeroCopyOutputStream.
                                          _vptr_ZeroCopyOutputStream);
            }
            else {
LAB_002ecad5:
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_e0);
            }
            local_1c0._0_8_ = local_1c0 + 0x10;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 == paVar18) {
              local_1c0._16_8_ = paVar18->_M_allocated_capacity;
              local_1c0._24_8_ = puVar12[3];
            }
            else {
              local_1c0._16_8_ = paVar18->_M_allocated_capacity;
              local_1c0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar12;
            }
            local_1c0._8_8_ = puVar12[1];
            *puVar12 = paVar18;
            puVar12[1] = 0;
            paVar18->_M_local_buf[0] = '\0';
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_1c0);
            psVar16 = puVar12 + 2;
            if ((size_type *)*puVar12 == psVar16) {
              local_1f8._16_8_ = *psVar16;
              local_1f8._24_8_ = puVar12[3];
              local_1f8._0_8_ = plVar21;
            }
            else {
              local_1f8._16_8_ = *psVar16;
              local_1f8._0_8_ = (size_type *)*puVar12;
            }
            local_1f8._8_8_ = puVar12[1];
            *puVar12 = psVar16;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1f8);
            if ((long *)local_1f8._0_8_ != plVar21) {
              operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1c0 + 0x10)) {
              operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
            }
            if (local_e0 != local_d0) {
              operator_delete(local_e0,(ulong)(local_d0[0] + 1));
            }
            if (local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != &local_178) {
              operator_delete(local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream,
                              (ulong)(local_178 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
            if (local_100.ptr_ != &local_f0) {
              operator_delete(local_100.ptr_,
                              (ulong)((long)&((local_f0.fields_)->
                                             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            uVar23 = local_c0.field_2._M_allocated_capacity;
            _Var25._M_p = local_c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_002ecde6:
              operator_delete(_Var25._M_p,
                              (ulong)((long)&(((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                                *)uVar23)->
                                             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
LAB_002ecdee:
            bVar3 = false;
            bVar20 = false;
          }
          else {
            if (*(DescriptorBuilder **)(local_200.descriptor + 0x58) !=
                (DescriptorBuilder *)local_140.descriptor) {
              if (*(char *)&((*(DescriptorBuilder **)(local_200.descriptor + 0x58))->
                            options_to_interpret_).
                            super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01')
              goto LAB_002ec612;
              std::operator+(&local_168,"Option field \"",&local_138);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
              local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = &local_178;
              pp_Var17 = (_func_int **)(plVar13 + 2);
              if ((_func_int **)*plVar13 == pp_Var17) {
                local_178 = *pp_Var17;
                lStack_170 = plVar13[3];
              }
              else {
                local_178 = *pp_Var17;
                local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream =
                     (_func_int **)*plVar13;
              }
              local_188.target_ = (string *)plVar13[1];
              *plVar13 = (long)pp_Var17;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_188,**(ulong **)local_140.descriptor);
              local_1c0._0_8_ = local_1c0 + 0x10;
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 == paVar18) {
                local_1c0._16_8_ = paVar18->_M_allocated_capacity;
                local_1c0._24_8_ = puVar12[3];
              }
              else {
                local_1c0._16_8_ = paVar18->_M_allocated_capacity;
                local_1c0._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar12;
              }
              local_1c0._8_8_ = puVar12[1];
              *puVar12 = paVar18;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_1c0);
              psVar16 = puVar12 + 2;
              if ((size_type *)*puVar12 == psVar16) {
                local_1f8._16_8_ = *psVar16;
                local_1f8._24_8_ = puVar12[3];
                local_1f8._0_8_ = plVar21;
              }
              else {
                local_1f8._16_8_ = *psVar16;
                local_1f8._0_8_ = (size_type *)*puVar12;
              }
              local_1f8._8_8_ = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1f8);
              if ((long *)local_1f8._0_8_ != plVar21) {
                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1c0 + 0x10)) {
                operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
              }
              if (local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != &local_178) {
                operator_delete(local_188.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream,
                                (ulong)(local_178 + 1));
              }
              uVar23 = local_168.field_2._M_allocated_capacity;
              _Var25._M_p = local_168._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_002ecde6;
              goto LAB_002ecdee;
            }
            bVar3 = true;
            if (index < (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.
                        current_size_ + -1) {
              if (*(GoogleOnceDynamic **)(local_200.descriptor + 0x40) != (GoogleOnceDynamic *)0x0)
              {
                GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                          (*(GoogleOnceDynamic **)(local_200.descriptor + 0x40),
                           FieldDescriptor::TypeOnceInit,local_200.field_descriptor);
              }
              if ((*(uint *)(aVar4.descriptor + 0x48) & 0xfffffffe) == 10) {
                if (*(int *)(local_200.descriptor + 0x4c) != 3) {
                  if (iStack_110._M_current == local_108) {
                    std::
                    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                *)&local_118,iStack_110,&local_200.field_descriptor);
                  }
                  else {
                    *iStack_110._M_current = (FieldDescriptor *)local_200;
                    iStack_110._M_current = iStack_110._M_current + 1;
                  }
                  aVar19 = local_200;
                  if (*(GoogleOnceDynamic **)(local_200.descriptor + 0x40) !=
                      (GoogleOnceDynamic *)0x0) {
                    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                              (*(GoogleOnceDynamic **)(local_200.descriptor + 0x40),
                               FieldDescriptor::TypeOnceInit,local_200.field_descriptor);
                  }
                  local_140 = *(anon_union_8_8_13f84498_for_Symbol_2 *)(aVar19.descriptor + 0x70);
                  goto LAB_002ecdf8;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1c0,"Option field \"",&local_138);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_1c0);
                psVar16 = puVar12 + 2;
                if ((size_type *)*puVar12 == psVar16) {
                  local_1f8._16_8_ = *psVar16;
                  local_1f8._24_8_ = puVar12[3];
                  local_1f8._0_8_ = plVar21;
                }
                else {
                  local_1f8._16_8_ = *psVar16;
                  local_1f8._0_8_ = (size_type *)*puVar12;
                }
                local_1f8._8_8_ = puVar12[1];
                *puVar12 = psVar16;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                AddError(this->builder_,&this->options_to_interpret_->element_name,
                         &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1f8
                        );
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1c0,"Option \"",&local_138);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_1c0);
                psVar16 = puVar12 + 2;
                if ((size_type *)*puVar12 == psVar16) {
                  local_1f8._16_8_ = *psVar16;
                  local_1f8._24_8_ = puVar12[3];
                  local_1f8._0_8_ = plVar21;
                }
                else {
                  local_1f8._16_8_ = *psVar16;
                  local_1f8._0_8_ = (size_type *)*puVar12;
                }
                local_1f8._8_8_ = puVar12[1];
                *puVar12 = psVar16;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                AddError(this->builder_,&this->options_to_interpret_->element_name,
                         &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1f8
                        );
              }
LAB_002ecdbb:
              if ((long *)local_1f8._0_8_ != plVar21) {
                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
              }
              uVar23 = local_1c0._16_8_;
              _Var25._M_p = (pointer)local_1c0._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1c0 + 0x10)) goto LAB_002ecdee;
              goto LAB_002ecde6;
            }
          }
LAB_002ecdf8:
          if (!bVar3) break;
          index = index + 1;
          pUVar24 = this->uninterpreted_option_;
          iVar9 = (pUVar24->name_).super_RepeatedPtrFieldBase.current_size_;
          bVar8 = index < iVar9;
        } while (index < iVar9);
      }
      iVar7._M_current = iStack_110._M_current;
      cVar6._M_current = local_118._M_current;
      aVar19 = local_200;
      if (!bVar8) {
        if (*(int *)(local_200.descriptor + 0x4c) != 3) {
          iVar9 = (*(local_148->super_MessageLite)._vptr_MessageLite[0x16])();
          pUVar14 = (UnknownFieldSet *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar9) + 0x10))
                              ((long *)CONCAT44(extraout_var_01,iVar9),local_148);
          bVar8 = ExamineIfOptionIsSet
                            (this,cVar6,(const_iterator)iVar7._M_current,aVar19.field_descriptor,
                             &local_138,pUVar14);
          if (!bVar8) {
            bVar20 = false;
            goto LAB_002ed155;
          }
        }
        local_168._M_dataplus._M_p = (pointer)operator_new(8);
        *(vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> **
         )local_168._M_dataplus._M_p =
             (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)0x0;
        bVar8 = SetOptionValue(this,local_200.field_descriptor,
                               (UnknownFieldSet *)local_168._M_dataplus._M_p);
        if (bVar8) {
          iVar7._M_current = iStack_110._M_current;
          do {
            ppFVar26 = iVar7._M_current;
            cVar6._M_current = local_118._M_current;
            if (ppFVar26 == local_118._M_current) break;
            local_100.ptr_ = (UnknownFieldSet *)operator_new(8);
            (local_100.ptr_)->fields_ =
                 (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0;
            pFVar2 = ppFVar26[-1];
            if (*(GoogleOnceDynamic **)(pFVar2 + 0x40) != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                        (*(GoogleOnceDynamic **)(pFVar2 + 0x40),FieldDescriptor::TypeOnceInit,pFVar2
                        );
            }
            iVar7._M_current = ppFVar26 + -1;
            if (*(int *)(pFVar2 + 0x48) == 10) {
              if (local_100.ptr_ == (UnknownFieldSet *)0x0) {
LAB_002ed1ce:
                __assert_fail("ptr_ != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                              ,0x5f,
                              "C *google::protobuf::internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator->() const [C = google::protobuf::UnknownFieldSet]"
                             );
              }
              pUVar14 = UnknownFieldSet::AddGroup(local_100.ptr_,*(int *)(*iVar7._M_current + 0x38))
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) goto LAB_002ed1af;
              UnknownFieldSet::MergeFrom(pUVar14,(UnknownFieldSet *)local_168._M_dataplus._M_p);
LAB_002ed050:
              p.ptr_ = local_100.ptr_;
              local_100.ptr_ = (UnknownFieldSet *)0x0;
              internal::scoped_ptr<google::protobuf::UnknownFieldSet>::reset
                        ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&local_168,p.ptr_);
              bVar8 = true;
            }
            else {
              if (*(int *)(pFVar2 + 0x48) == 0xb) {
                if (local_100.ptr_ == (UnknownFieldSet *)0x0) goto LAB_002ed1ce;
                psVar15 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                                    (local_100.ptr_,*(int *)(*iVar7._M_current + 0x38));
                io::StringOutputStream::StringOutputStream(&local_188,psVar15);
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)local_1c0,&local_188.super_ZeroCopyOutputStream);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  internal::WireFormat::SerializeUnknownFields
                            ((UnknownFieldSet *)local_168._M_dataplus._M_p,
                             (CodedOutputStream *)local_1c0);
                  if (local_1c0[0x18] == '\x01') {
                    internal::LogMessage::LogMessage
                              ((LogMessage *)local_1f8,LOGLEVEL_DFATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                               ,0x1818);
                    pLVar10 = internal::LogMessage::operator<<
                                        ((LogMessage *)local_1f8,"CHECK failed: !out.HadError(): ");
                    pLVar10 = internal::LogMessage::operator<<
                                        (pLVar10,
                                         "Unexpected failure while serializing option submessage ");
                    pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_138);
                    pLVar10 = internal::LogMessage::operator<<(pLVar10,"\".");
                    internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar10);
                    internal::LogMessage::~LogMessage((LogMessage *)local_1f8);
                  }
                  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_1c0);
                  io::StringOutputStream::~StringOutputStream(&local_188);
                  goto LAB_002ed050;
                }
                goto LAB_002ed1af;
              }
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_1c0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                         ,0x1825);
              pLVar10 = internal::LogMessage::operator<<
                                  ((LogMessage *)local_1c0,"Invalid wire type for CPPTYPE_MESSAGE: "
                                  );
              pFVar2 = *iVar7._M_current;
              if (*(GoogleOnceDynamic **)(pFVar2 + 0x40) != (GoogleOnceDynamic *)0x0) {
                GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                          (*(GoogleOnceDynamic **)(pFVar2 + 0x40),FieldDescriptor::TypeOnceInit,
                           pFVar2);
              }
              pLVar10 = internal::LogMessage::operator<<(pLVar10,*(int *)(pFVar2 + 0x48));
              internal::LogFinisher::operator=((LogFinisher *)&local_188,pLVar10);
              internal::LogMessage::~LogMessage((LogMessage *)local_1c0);
              bVar8 = false;
              bVar20 = false;
            }
            internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr(&local_100);
          } while (bVar8);
          pMVar5 = local_148;
          if (ppFVar26 == cVar6._M_current) {
            iVar9 = (*(local_148->super_MessageLite)._vptr_MessageLite[0x16])(local_148);
            pUVar14 = (UnknownFieldSet *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar9) + 0x18))
                                ((long *)CONCAT44(extraout_var_02,iVar9),pMVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
LAB_002ed1af:
              __assert_fail("ptr_ != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                            ,0x5b,
                            "C &google::protobuf::internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*() const [C = google::protobuf::UnknownFieldSet]"
                           );
            }
            bVar20 = true;
            UnknownFieldSet::MergeFrom(pUVar14,(UnknownFieldSet *)local_168._M_dataplus._M_p);
          }
        }
        else {
          bVar20 = false;
        }
        internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr
                  ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&local_168);
      }
LAB_002ed155:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
      if (local_118._M_current != (FieldDescriptor **)0x0) {
        operator_delete(local_118._M_current,(long)local_108 - (long)local_118._M_current);
        return bVar20;
      }
      return bVar20;
    }
    local_1f8._0_8_ = (long *)0x39;
    local_a0._0_8_ = local_a0 + 0x10;
    local_a0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a0,(ulong)local_1f8);
    local_a0._16_8_ = local_1f8._0_8_;
    builtin_strncpy((char *)(local_a0._0_8_ + 0x29),"rpreted_",8);
    builtin_strncpy((char *)(local_a0._0_8_ + 0x31),"option\".",8);
    *(undefined8 *)(local_a0._0_8_ + 0x20) = 0x746e696e75222065;
    *(undefined8 *)(local_a0._0_8_ + 0x28) = 0x6465746572707265;
    *(undefined8 *)(local_a0._0_8_ + 0x10) = 0x6573657220657375;
    *(undefined8 *)(local_a0._0_8_ + 0x18) = 0x6d616e2064657672;
    *(undefined8 *)local_a0._0_8_ = 0x6d206e6f6974704f;
    *(undefined8 *)(local_a0._0_8_ + 8) = 0x20746f6e20747375;
    local_a0._8_8_ = local_1f8._0_8_;
    *(char *)(local_a0._0_8_ + local_1f8._0_8_) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_a0);
    plVar21 = (long *)local_a0._16_8_;
    plVar13 = (long *)local_a0._0_8_;
    if ((undefined1 *)local_a0._0_8_ == local_a0 + 0x10) {
      return false;
    }
  }
  operator_delete(plVar13,(ulong)((long)plVar21 + 1));
  return false;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError("Option must not use reserved name "
                        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = NULL;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the
  // file we're currently building. The descriptor should be there as long as
  // the file we're building imported "google/protobuf/descriptors.proto".

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
    options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = NULL;
  std::vector<const FieldDescriptor*> intermediate_fields;
  string debug_msg_name = "";

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol = builder_->LookupSymbol(name_part,
                                      options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == NULL) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError("Option \"" + debug_msg_name + "\" unknown.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else if (i < uninterpreted_option_->name_size() - 1) {
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        return AddNameError("Option \"" +  debug_msg_name +
                            "\" is an atomic type, not a message.");
      } else if (field->is_repeated()) {
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is a repeated message. Repeated message "
                            "options must be initialized using an "
                            "aggregate value.");
      } else {
        // Drill down into the submessage.
        intermediate_fields.push_back(field);
        descriptor = field->message_type();
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() && !ExamineIfOptionIsSet(
          intermediate_fields.begin(),
          intermediate_fields.end(),
          field, debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }


  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  google::protobuf::scoped_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    google::protobuf::scoped_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
         parent_unknown_fields->AddGroup((*iter)->number())
                              ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  return true;
}